

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O2

void __thiscall Js::DebugManager::UnsetCurrentInterpreterLocation(DebugManager *this)

{
  ReferencedArenaAdapter *pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  InterpreterHaltState *pIVar5;
  ArenaAllocator *pAVar6;
  ArenaData *guestArena;
  
  pIVar5 = this->pCurrentInterpreterLocation;
  if (pIVar5 == (InterpreterHaltState *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0x65,"(pCurrentInterpreterLocation)","pCurrentInterpreterLocation")
    ;
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pIVar5 = this->pCurrentInterpreterLocation;
    if (pIVar5 == (InterpreterHaltState *)0x0) {
      return;
    }
  }
  pRVar1 = pIVar5->referencedDiagnosticArena;
  if (pRVar1 != (ReferencedArenaAdapter *)0x0) {
    if (pRVar1->deleteFlag == false) {
      pAVar6 = pRVar1->arena;
    }
    else {
      pAVar6 = (ArenaAllocator *)0x0;
    }
    guestArena = &(pAVar6->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>)
                  .super_ArenaData;
    if (pAVar6 == (ArenaAllocator *)0x0) {
      guestArena = (ArenaData *)0x0;
    }
    Memory::Recycler::UnregisterExternalGuestArena(this->pThreadContext->recycler,guestArena);
    Memory::ReferencedArenaAdapter::DeleteArena
              (this->pCurrentInterpreterLocation->referencedDiagnosticArena);
    Memory::RefCounted::Release
              (&this->pCurrentInterpreterLocation->referencedDiagnosticArena->super_RefCounted);
  }
  this->pCurrentInterpreterLocation = (InterpreterHaltState *)0x0;
  return;
}

Assistant:

void DebugManager::UnsetCurrentInterpreterLocation()
    {
        Assert(pCurrentInterpreterLocation);

        if (pCurrentInterpreterLocation)
        {
            // pCurrentInterpreterLocation->referencedDiagnosticArena could be null if we ran out of memory during SetCurrentInterpreterLocation
            if (pCurrentInterpreterLocation->referencedDiagnosticArena)
            {
                pThreadContext->GetRecycler()->UnregisterExternalGuestArena(pCurrentInterpreterLocation->referencedDiagnosticArena->Arena());
                pCurrentInterpreterLocation->referencedDiagnosticArena->DeleteArena();
                pCurrentInterpreterLocation->referencedDiagnosticArena->Release();
            }

            pCurrentInterpreterLocation = nullptr;
        }
    }